

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict get_compound_literal(node_t_conflict n,int *addr_p)

{
  node_code_t nVar1;
  int iVar2;
  
  iVar2 = 0;
  do {
    if (n == (node_t_conflict)0x0) {
      return (node_t_conflict)0x0;
    }
    nVar1 = n->code;
    if (nVar1 == N_ADDR) {
      iVar2 = iVar2 + 1;
    }
    else if (nVar1 == N_DEREF) {
      iVar2 = iVar2 + -1;
    }
    else if (nVar1 != N_CAST) {
      if ((2 < nVar1 - N_STR) && (nVar1 != N_COMPOUND_LITERAL)) {
        return (node_t_conflict)0x0;
      }
      if (iVar2 < 0) {
        return (node_t_conflict)0x0;
      }
      *addr_p = (uint)(iVar2 != 0);
      return n;
    }
    if (iVar2 - 2U < 0xfffffffd) {
      return (node_t_conflict)0x0;
    }
    n = (n->u).ops.head;
  } while( true );
}

Assistant:

static node_t get_compound_literal (node_t n, int *addr_p) {
  for (int addr = 0; n != NULL; n = NL_HEAD (n->u.ops)) {
    switch (n->code) {
    case N_ADDR: addr++; break;
    case N_DEREF: addr--; break;
    case N_CAST: break;  // ???
    case N_STR:
    case N_STR16:
    case N_STR32:
    case N_COMPOUND_LITERAL:
      if (addr < 0) return NULL;
      *addr_p = addr > 0;
      return n;
      break;
    default: return NULL;
    }
    if (addr != -1 && addr != 0 && addr != 1) return NULL;
  }
  return NULL;
}